

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_variable.hpp
# Opt level: O0

bool __thiscall
boost::condition_variable::do_wait_until
          (condition_variable *this,unique_lock<boost::mutex> *m,timespec *timeout)

{
  int iVar1;
  timespec *in_RDX;
  pthread_mutex_t *in_RDI;
  pthread_mutex_t *the_mutex;
  interruption_checker check_for_interruption;
  lock_on_exit<boost::unique_lock<boost::mutex>_> guard;
  int cond_res;
  unique_lock<boost::mutex> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  pthread_cond_t *in_stack_ffffffffffffff70;
  pthread_mutex_t *in_stack_ffffffffffffff78;
  interruption_checker *in_stack_ffffffffffffff80;
  condition_error *in_stack_ffffffffffffffc0;
  lock_on_exit<boost::unique_lock<boost::mutex>_> local_30;
  int local_24;
  timespec *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::lock_on_exit(&local_30);
  detail::interruption_checker::interruption_checker
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::activate
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)(in_RDI + 1),in_RDI,local_20);
  local_24 = iVar1;
  detail::interruption_checker::unlock_if_locked
            ((interruption_checker *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::deactivate
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff50));
  detail::interruption_checker::~interruption_checker((interruption_checker *)0x2a5903);
  thread_cv_detail::lock_on_exit<boost::unique_lock<boost::mutex>_>::~lock_on_exit
            ((lock_on_exit<boost::unique_lock<boost::mutex>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff50));
  this_thread::interruption_point();
  if (local_24 == 0x6e) {
    local_1 = false;
  }
  else {
    if (local_24 != 0) {
      condition_error::condition_error
                ((condition_error *)&in_stack_ffffffffffffff70->__data,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff60);
      throw_exception<boost::condition_error>(in_stack_ffffffffffffffc0);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool condition_variable::do_wait_until(
                unique_lock<mutex>& m,
                struct timespec const &timeout)
    {
#if defined BOOST_THREAD_THROW_IF_PRECONDITION_NOT_SATISFIED
        if (!m.owns_lock())
        {
            boost::throw_exception(condition_error(EPERM, "boost::condition_variable::do_wait_until() failed precondition mutex not owned"));
        }
#endif
        int cond_res;
        {
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
            thread_cv_detail::lock_on_exit<unique_lock<mutex> > guard;
            detail::interruption_checker check_for_interruption(&internal_mutex,&cond);
            pthread_mutex_t* the_mutex = &internal_mutex;
            guard.activate(m);
            cond_res=pthread_cond_timedwait(&cond,the_mutex,&timeout);
            check_for_interruption.unlock_if_locked();
            guard.deactivate();
#else
            pthread_mutex_t* the_mutex = m.mutex()->native_handle();
            cond_res=pthread_cond_timedwait(&cond,the_mutex,&timeout);
#endif
        }
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
        this_thread::interruption_point();
#endif
        if(cond_res==ETIMEDOUT)
        {
            return false;
        }
        if(cond_res)
        {
            boost::throw_exception(condition_error(cond_res, "boost::condition_variable::do_wait_until failed in pthread_cond_timedwait"));
        }
        return true;
    }